

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reporter.cc
# Opt level: O3

void __thiscall benchmark::JSONReporter::PrintRunData(JSONReporter *this,Run *run)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  double dVar4;
  string indent;
  string local_98;
  string local_78;
  char *local_58;
  long local_50;
  char local_48 [16];
  double local_38;
  double local_30;
  
  local_38 = run->cpu_accumulated_time * 1000000000.0;
  local_30 = run->real_accumulated_time * 1000000000.0;
  if (run->iterations != 0) {
    dVar4 = (double)run->iterations;
    local_30 = local_30 / dVar4;
    local_38 = local_38 / dVar4;
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x06');
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58,local_50);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"name","");
  StringPrintF_abi_cxx11_
            (&local_98,"\"%s\": \"%s\"",local_78._M_dataplus._M_p,
             (run->benchmark_name)._M_dataplus._M_p);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                              local_98._M_dataplus._M_p._0_1_),
                      local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58,local_50);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"iterations","");
  anon_unknown_1::FormatKV(&local_98,&local_78,run->iterations);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                              local_98._M_dataplus._M_p._0_1_),
                      local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58,local_50);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"real_time","");
  anon_unknown_1::FormatKV(&local_98,&local_78,(long)(local_30 + 0.5));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                              local_98._M_dataplus._M_p._0_1_),
                      local_98._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58,local_50);
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"cpu_time","");
  anon_unknown_1::FormatKV(&local_98,&local_78,(long)(local_38 + 0.5));
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_
                                    ),local_98._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) != paVar2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (0.0 < run->bytes_per_second) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_58,local_50);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"bytes_per_second","");
    anon_unknown_1::FormatKV(&local_98,&local_78,(long)(run->bytes_per_second + 0.5));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                       local_98._M_dataplus._M_p._0_1_),local_98._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) != paVar2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if (0.0 < run->items_per_second) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_58,local_50);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"items_per_second","");
    anon_unknown_1::FormatKV(&local_98,&local_78,(long)(run->items_per_second + 0.5));
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                       local_98._M_dataplus._M_p._0_1_),local_98._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) != paVar2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  if ((run->report_label)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,",\n",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_58,local_50);
    local_78._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"label","");
    StringPrintF_abi_cxx11_
              (&local_98,"\"%s\": \"%s\"",local_78._M_dataplus._M_p,
               (run->report_label)._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)CONCAT71(local_98._M_dataplus._M_p._1_7_,
                                       local_98._M_dataplus._M_p._0_1_),local_98._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_) != paVar2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_98._M_dataplus._M_p._1_7_,local_98._M_dataplus._M_p._0_1_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != paVar1) {
      operator_delete(local_78._M_dataplus._M_p);
    }
  }
  local_98._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_98,1);
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void JSONReporter::PrintRunData(Run const& run) {
    double const multiplier = 1e9; // nano second multiplier
    double cpu_time = run.cpu_accumulated_time * multiplier;
    double real_time = run.real_accumulated_time * multiplier;
    if (run.iterations != 0) {
        real_time = real_time / static_cast<double>(run.iterations);
        cpu_time = cpu_time / static_cast<double>(run.iterations);
    }

    std::string indent(6, ' ');
    std::ostream& out = std::cout;
    out << indent
        << FormatKV("name", run.benchmark_name)
        << ",\n";
    out << indent
        << FormatKV("iterations", run.iterations)
        << ",\n";
    out << indent
        << FormatKV("real_time", RoundDouble(real_time))
        << ",\n";
    out << indent
        << FormatKV("cpu_time", RoundDouble(cpu_time));
    if (run.bytes_per_second > 0.0) {
        out << ",\n" << indent
            << FormatKV("bytes_per_second", RoundDouble(run.bytes_per_second));
    }
    if (run.items_per_second > 0.0) {
        out << ",\n" << indent
            << FormatKV("items_per_second", RoundDouble(run.items_per_second));
    }
    if (!run.report_label.empty()) {
        out << ",\n" << indent
            << FormatKV("label", run.report_label);
    }
    out << '\n';
}